

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O2

void __thiscall QPixmap::detach(QPixmap *this)

{
  QPlatformPixmap *pmd;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  QPixmap local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pmd = (this->data).d.ptr;
  if (pmd != (QPlatformPixmap *)0x0) {
    if (pmd->id == 0) {
      QImage::detach((QImage *)(pmd + 1));
      pmd = (this->data).d.ptr;
    }
    if ((pmd->is_cached != 0) &&
       ((pmd->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 1)) {
      QImagePixmapCleanupHooks::executePlatformPixmapModificationHooks(pmd);
      pmd = (this->data).d.ptr;
    }
    if ((pmd->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i != 1) {
      local_48 = 0;
      uStack_40 = 0xffffffffffffffff;
      copy(&local_30,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)&local_48);
      operator=(this,&local_30);
      ~QPixmap(&local_30);
      pmd = (this->data).d.ptr;
    }
    pmd->detach_no = pmd->detach_no + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmap::detach()
{
    if (!data)
        return;

    // QPixmap.data member may be QRuntimePlatformPixmap so use handle() function to get
    // the actual underlying runtime pixmap data.
    QPlatformPixmap *pd = handle();
    QPlatformPixmap::ClassId id = pd->classId();
    if (id == QPlatformPixmap::RasterClass) {
        QRasterPlatformPixmap *rasterData = static_cast<QRasterPlatformPixmap*>(pd);
        rasterData->image.detach();
    }

    if (data->is_cached && data->ref.loadRelaxed() == 1)
        QImagePixmapCleanupHooks::executePlatformPixmapModificationHooks(data.data());

    if (data->ref.loadRelaxed() != 1) {
        *this = copy();
    }
    ++data->detach_no;
}